

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_impl::file_system::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  undefined8 uVar4;
  char buffer [256];
  ofstream out;
  ifstream in;
  undefined1 local_538 [264];
  undefined4 local_430;
  long local_420 [64];
  long local_220 [65];
  EVP_PKEY_CTX *local_18;
  EVP_PKEY_CTX *local_10;
  undefined1 local_1;
  
  local_18 = src;
  local_10 = dst;
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,(string *)dst,_Var3);
  pEVar1 = local_18;
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_420,(string *)pEVar1,_Var3);
  bVar2 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (((bVar2 & 1) == 0) &&
     (bVar2 = std::ios::operator!((ios *)((long)local_420 + *(long *)(local_420[0] + -0x18))),
     (bVar2 & 1) == 0)) {
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::istream::read((char *)local_220,(long)local_538);
      std::istream::gcount();
      std::ostream::write((char *)local_420,(long)local_538);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_430 = 1;
  std::ofstream::~ofstream(local_420);
  uVar4 = std::ifstream::~ifstream(local_220);
  return (uint)CONCAT71((int7)((ulong)uVar4 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool copy(const std::string &source, const std::string &dest)
		{
			std::ifstream in(source, std::ios_base::in | std::ios_base::binary);
			std::ofstream out(dest, std::ios_base::out | std::ios_base::binary);
			if (!in || !out)
				return false;
			char buffer[256];
			while (!in.eof()) {
				in.read(buffer, 256);
				out.write(buffer, in.gcount());
			}
			return true;
		}